

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::attachClause(Solver *this,CRef cr)

{
  bool bVar1;
  Lit p;
  int iVar2;
  Watcher *elem;
  CRef in_ESI;
  long in_RDI;
  Clause *c;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  CRef cr_00;
  Watcher local_3c;
  int local_34;
  int local_30;
  int local_2c;
  Watcher local_28;
  int local_20;
  int local_1c;
  Clause *local_18;
  CRef local_c;
  
  local_c = in_ESI;
  local_18 = ClauseAllocator::operator[]
                       ((ClauseAllocator *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        (CRef)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  elem = (Watcher *)(in_RDI + 0x1f8);
  local_20 = (int)Clause::operator[](local_18,0);
  local_1c = (int)operator~((Lit)local_20);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  ::operator[]((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
                *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),(Lit *)elem);
  cr_00 = local_c;
  local_2c = (int)Clause::operator[](local_18,1);
  Watcher::Watcher(&local_28,cr_00,(Lit)local_2c);
  vec<Minisat::Solver::Watcher,_int>::push
            ((vec<Minisat::Solver::Watcher,_int> *)CONCAT44(cr_00,in_stack_ffffffffffffff90),elem);
  local_34 = (int)Clause::operator[](local_18,1);
  local_30 = (int)operator~((Lit)local_34);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  ::operator[]((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
                *)CONCAT44(cr_00,in_stack_ffffffffffffff90),(Lit *)elem);
  p = Clause::operator[](local_18,0);
  Watcher::Watcher(&local_3c,local_c,p);
  vec<Minisat::Solver::Watcher,_int>::push
            ((vec<Minisat::Solver::Watcher,_int> *)CONCAT44(cr_00,in_stack_ffffffffffffff90),elem);
  bVar1 = Clause::learnt(local_18);
  if (bVar1) {
    *(long *)(in_RDI + 0xf0) = *(long *)(in_RDI + 0xf0) + 1;
    iVar2 = Clause::size(local_18);
    *(long *)(in_RDI + 0x100) = (long)iVar2 + *(long *)(in_RDI + 0x100);
  }
  else {
    *(long *)(in_RDI + 0xe8) = *(long *)(in_RDI + 0xe8) + 1;
    iVar2 = Clause::size(local_18);
    *(long *)(in_RDI + 0xf8) = (long)iVar2 + *(long *)(in_RDI + 0xf8);
  }
  return;
}

Assistant:

void Solver::attachClause(CRef cr){
    const Clause& c = ca[cr];
    assert(c.size() > 1);
    watches[~c[0]].push(Watcher(cr, c[1]));
    watches[~c[1]].push(Watcher(cr, c[0]));
    if (c.learnt()) num_learnts++, learnts_literals += c.size();
    else            num_clauses++, clauses_literals += c.size();
}